

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::TableDrivenEnabled
               (Descriptor *descriptor,Options *options)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  FieldDescriptor *this;
  OneofDescriptor *pOVar4;
  FieldOptions *this_00;
  FieldDescriptor *field;
  int i;
  int max_field_number;
  double table_sparseness;
  Options *options_local;
  Descriptor *descriptor_local;
  
  if ((options->table_driven_parsing & 1U) == 0) {
    descriptor_local._7_1_ = false;
  }
  else {
    iVar2 = Descriptor::extension_range_count(descriptor);
    if (iVar2 == 0) {
      pFVar3 = Descriptor::file(descriptor);
      bVar1 = UseUnknownFieldSet(pFVar3,options);
      if (bVar1) {
        descriptor_local._7_1_ = false;
      }
      else {
        pFVar3 = Descriptor::file(descriptor);
        bVar1 = HasFieldPresence(pFVar3);
        if (bVar1) {
          field._4_4_ = 0;
          for (field._0_4_ = 0; iVar2 = Descriptor::field_count(descriptor), (int)field < iVar2;
              field._0_4_ = (int)field + 1) {
            this = Descriptor::field(descriptor,(int)field);
            iVar2 = FieldDescriptor::number(this);
            if (field._4_4_ < iVar2) {
              field._4_4_ = FieldDescriptor::number(this);
            }
            bVar1 = FieldDescriptor::is_map(this);
            if (bVar1) {
              return false;
            }
            pOVar4 = FieldDescriptor::containing_oneof(this);
            if (pOVar4 != (OneofDescriptor *)0x0) {
              return false;
            }
            this_00 = FieldDescriptor::options(this);
            bVar1 = FieldOptions::weak(this_00);
            if (bVar1) {
              return false;
            }
          }
          if (field._4_4_ < 0x8000) {
            iVar2 = Descriptor::field_count(descriptor);
            if ((double)field._4_4_ * 0.5 < (double)iVar2) {
              bVar1 = IsMapEntryMessage(descriptor);
              if (bVar1) {
                descriptor_local._7_1_ = false;
              }
              else {
                descriptor_local._7_1_ = true;
              }
            }
            else {
              descriptor_local._7_1_ = false;
            }
          }
          else {
            descriptor_local._7_1_ = false;
          }
        }
        else {
          descriptor_local._7_1_ = false;
        }
      }
    }
    else {
      descriptor_local._7_1_ = false;
    }
  }
  return descriptor_local._7_1_;
}

Assistant:

bool TableDrivenEnabled(const Descriptor* descriptor, const Options& options) {
  if (!options.table_driven_parsing) {
    return false;
  }

  // Consider table-driven parsing.  We only do this if:
  // - There are no extensions
  if (descriptor->extension_range_count() != 0) {
    return false;
  }

  // - We are not using UnknownFieldSet (part of the non-lite library).
  if (UseUnknownFieldSet(descriptor->file(), options)) {
    return false;
  }

  // - We have has_bits for fields.  This avoids a check on every field we set
  //   when are present (the common case).
  if (!HasFieldPresence(descriptor->file())) {
    return false;
  }

  const double table_sparseness = 0.5;
  int max_field_number = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }

    // - There are no map fields.
    if (field->is_map()) {
      return false;
    }

    // - There are no oneof fields.
    if (field->containing_oneof()) {
      return false;
    }

    // - There are no weak fields.
    if (field->options().weak()) {
      return false;
    }
  }

  // - There range of field numbers is "small"
  if (max_field_number >= (2 << 14)) {
    return false;
  }

  // - Field numbers are relatively dense within the actual number of fields
  if (max_field_number * table_sparseness >= descriptor->field_count()) {
    return false;
  }

  // - This is not a MapEntryMessage.
  if (IsMapEntryMessage(descriptor)) {
    return false;
  }

  return true;
}